

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinitionUtil.cpp
# Opt level: O2

bool deqp::gles31::Functional::anon_unknown_3::traverseProgramVariablePath
               (vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                *typePath,Program *program,string *path,VariableSearchFilter *filter)

{
  Shader *pSVar1;
  pointer pVVar2;
  bool bVar3;
  __type _Var4;
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
  *pvVar5;
  long lVar6;
  long lVar7;
  char *nameWithPath;
  char *nameWithPath_00;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  byte bVar12;
  int varNdx;
  long lVar13;
  long lVar14;
  bool local_cd;
  string blockMemeberName;
  Data local_80;
  undefined4 local_78;
  string blockMemeberName_1;
  string blockName;
  
  lVar14 = 0;
LAB_005d7f3b:
  pvVar5 = ProgramInterfaceDefinition::Program::getShaders(program);
  lVar6 = (long)(int)((ulong)((long)(pvVar5->
                                    super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pvVar5->
                                   super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start) >> 3);
  if (lVar6 <= lVar14) {
    return false;
  }
  pvVar5 = ProgramInterfaceDefinition::Program::getShaders(program);
  pSVar1 = (pvVar5->
           super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
           )._M_impl.super__Vector_impl_data._M_start[lVar14];
  if ((filter->m_shaderTypeBits >> (pSVar1->m_shaderType & 0x1f) & 1) != 0) {
    pVVar2 = (typePath->
             super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((typePath->
        super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
        )._M_impl.super__Vector_impl_data._M_finish != pVVar2) {
      (typePath->
      super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
      )._M_impl.super__Vector_impl_data._M_finish = pVVar2;
    }
    lVar8 = 0;
    lVar13 = 0;
    while( true ) {
      lVar11 = *(long *)&(pSVar1->m_defaultBlock).variables.
                         super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                         ._M_impl;
      lVar7 = (long)*(pointer *)
                     ((long)&(pSVar1->m_defaultBlock).variables.
                             super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                     + 8) - lVar11;
      if ((int)(lVar7 / 0x60) <= lVar13) break;
      if (((filter->m_storageBits >> (*(uint *)(lVar11 + 0x18 + lVar8) & 0x1f) & 1) != 0) &&
         (bVar3 = traverseVariablePath(typePath,path,(VariableDeclaration *)(lVar11 + lVar8)), bVar3
         )) {
        return true;
      }
      lVar13 = lVar13 + 1;
      lVar8 = lVar8 + 0x60;
    }
    glu::parseVariableName_abi_cxx11_
              (&blockName,(glu *)(path->_M_dataplus)._M_p,(char *)(lVar7 % 0x60));
    local_cd = true;
    lVar8 = 0;
    while( true ) {
      lVar13 = *(long *)&(pSVar1->m_defaultBlock).interfaceBlocks.
                         super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                         ._M_impl.super__Vector_impl_data;
      if ((int)(((long)*(pointer *)
                        ((long)&(pSVar1->m_defaultBlock).interfaceBlocks.
                                super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                        + 8) - lVar13) / 0x90) <= lVar8) break;
      lVar11 = lVar8 * 0x90;
      if ((filter->m_storageBits >> (*(uint *)(lVar13 + 0x14 + lVar11) & 0x1f) & 1) != 0) {
        _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(lVar13 + lVar11 + 0x20),&blockName);
        if (_Var4) {
          std::__cxx11::string::substr((ulong)&blockMemeberName,(ulong)path);
          glu::parseVariableName_abi_cxx11_
                    (&blockMemeberName_1,(glu *)blockMemeberName._M_dataplus._M_p,nameWithPath_00);
          lVar8 = -1;
          lVar13 = -0x60;
          goto LAB_005d816b;
        }
        if (*(long *)(*(long *)&(pSVar1->m_defaultBlock).interfaceBlocks.
                                super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                                ._M_impl.super__Vector_impl_data + 0x48 + lVar11) == 0) {
          glu::parseVariableName_abi_cxx11_
                    (&blockMemeberName,(glu *)(path->_M_dataplus)._M_p,nameWithPath);
          lVar13 = -1;
          lVar7 = -0x60;
          do {
            lVar9 = *(long *)&(pSVar1->m_defaultBlock).interfaceBlocks.
                              super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                              ._M_impl.super__Vector_impl_data;
            lVar10 = *(long *)(lVar9 + 0x60 + lVar11);
            lVar9 = (long)(int)((*(long *)(lVar9 + 0x68 + lVar11) - lVar10) / 0x60);
            lVar13 = lVar13 + 1;
            if (lVar9 <= lVar13) {
              bVar12 = 0;
              goto LAB_005d8103;
            }
            lVar10 = lVar10 + lVar7;
            lVar7 = lVar7 + 0x60;
            _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(lVar10 + 0xa0),&blockMemeberName);
          } while (!_Var4);
          blockMemeberName_1._M_dataplus._M_p =
               (pointer)(*(long *)&(pSVar1->m_defaultBlock).interfaceBlocks.
                                   super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                                   ._M_impl.super__Vector_impl_data + lVar11);
          blockMemeberName_1._M_string_length._0_4_ = 1;
          std::
          vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
          ::
          emplace_back<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>
                    (typePath,(VariablePathComponent *)&blockMemeberName_1);
          local_cd = traverseVariablePath
                               (typePath,path,
                                (VariableDeclaration *)
                                (lVar7 + *(long *)(*(long *)&(pSVar1->m_defaultBlock).
                                                             interfaceBlocks.
                                                                                                                          
                                                  super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                                                  ._M_impl.super__Vector_impl_data + 0x60 + lVar11))
                               );
          bVar12 = 1;
LAB_005d8103:
          std::__cxx11::string::~string((string *)&blockMemeberName);
          if (lVar13 < lVar9) goto LAB_005d812a;
        }
      }
      lVar8 = lVar8 + 1;
    }
    bVar12 = 0;
LAB_005d812a:
    bVar12 = bVar12 & local_cd;
    goto LAB_005d8221;
  }
  goto LAB_005d8242;
  while( true ) {
    lVar7 = lVar7 + lVar13;
    lVar13 = lVar13 + 0x60;
    _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (lVar7 + 0xa0),&blockMemeberName_1);
    if (_Var4) break;
LAB_005d816b:
    lVar10 = *(long *)&(pSVar1->m_defaultBlock).interfaceBlocks.
                       super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                       ._M_impl.super__Vector_impl_data;
    lVar7 = *(long *)(lVar10 + 0x60 + lVar11);
    lVar10 = (long)(int)((*(long *)(lVar10 + 0x68 + lVar11) - lVar7) / 0x60);
    lVar8 = lVar8 + 1;
    if (lVar10 <= lVar8) goto LAB_005d81f8;
  }
  local_80.type =
       (VarType *)
       (*(long *)&(pSVar1->m_defaultBlock).interfaceBlocks.
                  super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>.
                  _M_impl.super__Vector_impl_data + lVar11);
  local_78 = 1;
  std::
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
  ::emplace_back<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>
            (typePath,(VariablePathComponent *)&local_80);
  local_cd = traverseVariablePath
                       (typePath,&blockMemeberName,
                        (VariableDeclaration *)
                        (lVar13 + *(long *)(*(long *)&(pSVar1->m_defaultBlock).interfaceBlocks.
                                                                                                            
                                                  super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                                                  ._M_impl.super__Vector_impl_data + 0x60 + lVar11))
                       );
LAB_005d81f8:
  std::__cxx11::string::~string((string *)&blockMemeberName_1);
  std::__cxx11::string::~string((string *)&blockMemeberName);
  bVar12 = lVar8 < lVar10 & local_cd;
LAB_005d8221:
  std::__cxx11::string::~string((string *)&blockName);
  if (bVar12 != 0) {
    return lVar14 < lVar6;
  }
LAB_005d8242:
  lVar14 = lVar14 + 1;
  goto LAB_005d7f3b;
}

Assistant:

static bool traverseProgramVariablePath (std::vector<VariablePathComponent>& typePath, const ProgramInterfaceDefinition::Program* program, const std::string& path, const VariableSearchFilter& filter)
{
	for (int shaderNdx = 0; shaderNdx < (int)program->getShaders().size(); ++shaderNdx)
	{
		const ProgramInterfaceDefinition::Shader* shader = program->getShaders()[shaderNdx];

		if (filter.matchesFilter(shader))
		{
			// \note modifying output variable even when returning false
			typePath.clear();
			if (traverseShaderVariablePath(typePath, shader, path, filter))
				return true;
		}
	}

	return false;
}